

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O2

string * __thiscall
cppcms::session_interface::session_cookie_name_abi_cxx11_
          (string *__return_storage_ptr__,session_interface *this)

{
  cached_settings *pcVar1;
  
  pcVar1 = cached_settings(this);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&(pcVar1->session).cookies);
  return __return_storage_ptr__;
}

Assistant:

std::string session_interface::session_cookie_name()
{
	return cached_settings().session.cookies.prefix;
}